

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MsgLoopFuture.h
# Opt level: O0

void __thiscall
loop::
Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::set_error(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *error)

{
  bool bVar1;
  __int_type _Var2;
  MessageLoop *local_98;
  type local_70;
  Closure local_40;
  MessageLoop *local_20;
  MessageLoop *msgloop;
  shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *error_local;
  Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  msgloop = (MessageLoop *)error;
  error_local = (shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
  do {
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)this);
  } while (_Var2 != 0);
  bVar1 = std::function::operator_cast_to_bool((function *)&(this->m_failure).second);
  if (bVar1) {
    if ((this->m_failure).first == (MessageLoop *)0x0) {
      local_98 = this->m_msgloop;
    }
    else {
      local_98 = (this->m_failure).first;
    }
    local_20 = local_98;
    std::
    bind<std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>&,std::shared_ptr<std::pair<int,std::__cxx11::string>>&>
              (&local_70,&(this->m_failure).second,error);
    std::function<void()>::
    function<std::_Bind<std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>,void>
              ((function<void()> *)&local_40,&local_70);
    MessageLoop::post_task(local_98,&local_40);
    std::function<void_()>::~function(&local_40);
    std::
    _Bind<std::function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::~_Bind(&local_70);
  }
  return;
}

Assistant:

void set_error(shared_ptr<T_ERROR> error) {
            while (m_lock != 0) {}
            if (m_failure.second) {
                auto msgloop = m_failure.first ? m_failure.first : m_msgloop;
                msgloop->post_task(std::bind(m_failure.second, error));
            }
        }